

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O2

int Pdr_ManCheckCube(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,Pdr_Set_t **ppPred,int nConfLimit,
                    int fTryConf,int fUseLit)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  Pdr_Set_t **ppPVar6;
  int iVar7;
  uint Entry;
  sat_solver *s;
  Vec_Int_t *pVVar8;
  Aig_Obj_t *pObj;
  long lVar9;
  abctime aVar10;
  long lVar11;
  Pdr_Set_t *pPVar12;
  abctime aVar13;
  int Lit;
  int local_4c;
  abctime local_48;
  Pdr_Set_t **local_40;
  Pdr_Set_t *local_38;
  
  p->nCalls = p->nCalls + 1;
  local_4c = fTryConf;
  local_40 = ppPred;
  s = Pdr_ManFetchSolver(p,k);
  local_38 = pCube;
  if (pCube == (Pdr_Set_t *)0x0) {
    local_48 = Abc_Clock();
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,p->iOutCur);
    iVar7 = Pdr_ObjSatVar(p,k,2,pObj);
    Lit = Abc_Var2Lit(iVar7,0);
    lVar11 = p->timeToStop;
    lVar5 = p->timeToStopOne;
    lVar9 = lVar5;
    if (((lVar11 != 0) && (lVar9 = lVar11, lVar5 != 0)) && (lVar9 = lVar5, lVar11 < lVar5)) {
      lVar9 = lVar11;
    }
    aVar10 = s->nRuntimeLimit;
    s->nRuntimeLimit = lVar9;
    iVar7 = sat_solver_solve(s,&Lit,&local_4c,(long)nConfLimit,0,0,0);
    s->nRuntimeLimit = aVar10;
    if (iVar7 == 0) {
      return -1;
    }
  }
  else {
    if (fUseLit == 0) {
      pVVar8 = Pdr_ManCubeToLits(p,k,pCube,0,1);
    }
    else {
      local_48 = CONCAT44(local_48._4_4_,nConfLimit);
      if ((k < 0) || (p->vActVars->nSize <= k)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = p->vActVars->pArray + (uint)k;
      *piVar1 = *piVar1 + 1;
      pVVar8 = Pdr_ManCubeToLits(p,k,pCube,1,0);
      iVar7 = Pdr_ManFreeVar(p,k);
      Entry = Abc_Var2Lit(iVar7,0);
      Lit = Entry;
      Vec_IntPush(pVVar8,Entry);
      iVar7 = sat_solver_addclause(s,pVVar8->pArray,pVVar8->pArray + pVVar8->nSize);
      if (iVar7 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                      ,0x143,
                      "int Pdr_ManCheckCube(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, int, int, int)"
                     );
      }
      sat_solver_compress(s);
      pVVar8 = Pdr_ManCubeToLits(p,k,pCube,0,1);
      if ((int)Entry < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      Vec_IntPush(pVVar8,Entry ^ 1);
      nConfLimit = (int)local_48;
    }
    local_48 = Abc_Clock();
    lVar11 = p->timeToStop;
    lVar5 = p->timeToStopOne;
    lVar9 = lVar5;
    if (((lVar11 != 0) && (lVar9 = lVar11, lVar5 != 0)) && (lVar9 = lVar5, lVar11 < lVar5)) {
      lVar9 = lVar11;
    }
    aVar10 = s->nRuntimeLimit;
    s->nRuntimeLimit = lVar9;
    if (local_4c != 0) {
      nConfLimit = p->pPars->nConfGenLimit;
    }
    iVar7 = sat_solver_solve(s,pVVar8->pArray,pVVar8->pArray + pVVar8->nSize,(long)nConfLimit,0,0,0)
    ;
    s->nRuntimeLimit = aVar10;
    if (iVar7 == 0) {
      if (local_4c == 0) {
        return -1;
      }
      if (p->pPars->nConfGenLimit == 0) {
        return -1;
      }
      iVar7 = 1;
    }
  }
  ppPVar6 = local_40;
  aVar10 = Abc_Clock();
  lVar11 = aVar10 - local_48;
  p->tSat = p->tSat + lVar11;
  if (iVar7 == -1) {
    p->tSatUnsat = p->tSatUnsat + lVar11;
    p->nCallsU = p->nCallsU + 1;
    iVar7 = 1;
    if (ppPVar6 != (Pdr_Set_t **)0x0) {
      *ppPVar6 = (Pdr_Set_t *)0x0;
    }
  }
  else {
    p->tSatSat = p->tSatSat + lVar11;
    p->nCallsS = p->nCallsS + 1;
    iVar7 = 0;
    if (ppPVar6 != (Pdr_Set_t **)0x0) {
      aVar10 = Abc_Clock();
      if (p->pPars->fNewXSim == 0) {
        pPVar12 = Pdr_ManTernarySim(p,k,local_38);
      }
      else {
        pPVar12 = Txs3_ManTernarySim(p->pTxs3,k,local_38);
      }
      *ppPVar6 = pPVar12;
      aVar13 = Abc_Clock();
      p->tTsim = p->tTsim + (aVar13 - aVar10);
      uVar2 = p->nXsimRuns;
      uVar3 = p->nXsimLits;
      iVar4 = (*ppPVar6)->nLits;
      p->nXsimRuns = uVar2 + 1;
      p->nXsimLits = iVar4 + uVar3;
    }
  }
  return iVar7;
}

Assistant:

int Pdr_ManCheckCube( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, Pdr_Set_t ** ppPred, int nConfLimit, int fTryConf, int fUseLit )
{ 
    //int fUseLit = 0;
    int fLitUsed = 0;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int Lit, RetValue;
    abctime clk, Limit;
    p->nCalls++;
    pSat = Pdr_ManFetchSolver( p, k );
    if ( pCube == NULL ) // solve the property
    {
        clk = Abc_Clock();
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p, k, 2, Aig_ManCo(p->pAig, p->iOutCur)), 0 ); // pos literal (property fails)
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, &Lit, &Lit + 1, nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
            return -1;
    }
    else // check relative containment in terms of next states
    {
        if ( fUseLit )
        {
            fLitUsed = 1;
            Vec_IntAddToEntry( p->vActVars, k, 1 );
            // add the cube in terms of current state variables
            vLits = Pdr_ManCubeToLits( p, k, pCube, 1, 0 );
            // add activation literal
            Lit = Abc_Var2Lit( Pdr_ManFreeVar(p, k), 0 );
            // add activation literal
            Vec_IntPush( vLits, Lit );
            RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            assert( RetValue == 1 );
            sat_solver_compress( pSat );
            // create assumptions
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );
            // add activation literal
            Vec_IntPush( vLits, Abc_LitNot(Lit) );
        }
        else
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );

        // solve 
        clk = Abc_Clock();
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), fTryConf ? p->pPars->nConfGenLimit : nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
        {
            if ( fTryConf && p->pPars->nConfGenLimit )
                RetValue = l_True;
            else
                return -1;
        }
    }
    clk = Abc_Clock() - clk;
    p->tSat += clk;
    assert( RetValue != l_Undef );
    if ( RetValue == l_False )
    {
        p->tSatUnsat += clk;
        p->nCallsU++;
        if ( ppPred )
            *ppPred = NULL;
        RetValue = 1;
    }
    else // if ( RetValue == l_True )
    {
        p->tSatSat += clk;
        p->nCallsS++;
        if ( ppPred )
        {
            abctime clk = Abc_Clock();
            if ( p->pPars->fNewXSim )
                *ppPred = Txs3_ManTernarySim( p->pTxs3, k, pCube );
            else
                *ppPred = Pdr_ManTernarySim( p, k, pCube );
            p->tTsim += Abc_Clock() - clk;
            p->nXsimLits += (*ppPred)->nLits;
            p->nXsimRuns++;
        }
        RetValue = 0;
    }

/* // for some reason, it does not work...
    if ( fLitUsed )
    {
        int RetValue;
        Lit = Abc_LitNot(Lit);
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
        sat_solver_compress( pSat );
    }
*/
    return RetValue;
}